

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

void Convert8To16Plane(uint8_t *src_y,int src_stride_y,uint16_t *dst_y,int dst_stride_y,int scale,
                      int width,int height)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  int local_40;
  int local_3c;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    dst_y = dst_y + ~height * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  local_40 = src_stride_y;
  local_3c = dst_stride_y;
  if (dst_stride_y == width && src_stride_y == width) {
    width = iVar1 * src_stride_y;
    iVar1 = 1;
    local_40 = 0;
    local_3c = 0;
  }
  iVar2 = libyuv::TestCpuFlag(0x20);
  if ((width & 0xfU) == 0) {
    pcVar3 = Convert8To16Row_SSE2;
  }
  else {
    pcVar3 = Convert8To16Row_Any_SSE2;
  }
  if (iVar2 == 0) {
    pcVar3 = Convert8To16Row_C;
  }
  iVar2 = libyuv::TestCpuFlag(0x400);
  if ((width & 0x1fU) == 0) {
    pcVar4 = Convert8To16Row_AVX2;
  }
  else {
    pcVar4 = Convert8To16Row_Any_AVX2;
  }
  if (iVar2 == 0) {
    pcVar4 = pcVar3;
  }
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    (*pcVar4)(src_y,dst_y,scale,width);
    src_y = src_y + local_40;
    dst_y = dst_y + local_3c;
  }
  return;
}

Assistant:

LIBYUV_API
void Convert8To16Plane(const uint8_t* src_y,
                       int src_stride_y,
                       uint16_t* dst_y,
                       int dst_stride_y,
                       int scale,  // 16384 for 10 bits
                       int width,
                       int height) {
  int y;
  void (*Convert8To16Row)(const uint8_t* src_y, uint16_t* dst_y, int scale,
                          int width) = Convert8To16Row_C;

  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_y = 0;
  }
#if defined(HAS_CONVERT8TO16ROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    Convert8To16Row = Convert8To16Row_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      Convert8To16Row = Convert8To16Row_SSE2;
    }
  }
#endif
#if defined(HAS_CONVERT8TO16ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    Convert8To16Row = Convert8To16Row_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      Convert8To16Row = Convert8To16Row_AVX2;
    }
  }
#endif

  // Convert plane
  for (y = 0; y < height; ++y) {
    Convert8To16Row(src_y, dst_y, scale, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
}